

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

result_type time_plain<trng::lcg64>(lcg64 *r)

{
  result_type rVar1;
  result_type rVar2;
  time_t *__timer;
  bool bVar3;
  double extraout_XMM0_Qa;
  timer T;
  string res;
  double local_20;
  
  T._resolution = 1e-06;
  T._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  rVar1 = (r->S).r;
  __timer = (time_t *)0x1000000;
  rVar2 = 0;
  while (bVar3 = __timer != (time_t *)0x0, __timer = (time_t *)((long)__timer + -1), bVar3) {
    rVar1 = rVar1 * (r->P).a + (r->P).b;
    rVar2 = rVar2 + rVar1;
  }
  (r->S).r = rVar1;
  timer::time(&T,__timer);
  local_20 = 16.777216 / extraout_XMM0_Qa;
  to_string<double>(&res,&local_20);
  while (res._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&res);
  }
  std::operator<<((ostream *)&std::cout,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  return rVar2;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}